

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O1

void __thiscall QGridLayout::sizeHint(QGridLayout *this)

{
  sizeHint((QGridLayout *)&this[-1].super_QLayout.super_QLayoutItem);
  return;
}

Assistant:

QSize QGridLayout::sizeHint() const
{
    Q_D(const QGridLayout);
    QSize result(d->sizeHint(horizontalSpacing(), verticalSpacing()));
    int left, top, right, bottom;
    d->effectiveMargins(&left, &top, &right, &bottom);
    result += QSize(left + right, top + bottom);
    return result;
}